

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix_dense.c
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  undefined1 auVar2 [16];
  N_Vector p_Var3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  N_Vector y;
  SUNMatrix A;
  long lVar10;
  undefined8 *puVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  char *__s;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  SUNContext sunctx;
  SUNMatrix local_68;
  undefined8 local_58;
  N_Vector local_50;
  undefined1 local_48 [16];
  long lVar28;
  
  iVar4 = SUNContext_Create(0,&local_58);
  if (iVar4 == 0) {
    if (argc < 4) {
      __s = "ERROR: THREE (3) Input required: matrix rows, matrix cols, print timing ";
    }
    else {
      lVar8 = atol(argv[1]);
      if (lVar8 < 1) {
        __s = "ERROR: number of rows must be a positive integer ";
      }
      else {
        lVar9 = atol(argv[2]);
        if (0 < lVar9) {
          iVar4 = atoi(argv[3]);
          SetTiming(iVar4);
          local_68 = (SUNMatrix)0x0;
          printf("\nDense matrix test: size %ld by %ld\n\n",lVar8,lVar9);
          local_50 = (N_Vector)N_VNew_Serial(lVar9,local_58);
          y = (N_Vector)N_VNew_Serial(lVar8,local_58);
          A = (SUNMatrix)SUNDenseMatrix(lVar8,lVar9,local_58);
          if (lVar8 == lVar9) {
            local_68 = (SUNMatrix)SUNDenseMatrix(lVar8,lVar8,local_58);
          }
          lVar10 = SUNDenseMatrix_Data(A);
          p_Var3 = local_50;
          auVar29 = _DAT_00103020;
          auVar2 = _DAT_00103010;
          uVar22 = lVar8 + 1U & 0xfffffffffffffffe;
          lVar12 = lVar8 + -1;
          auVar30._8_4_ = (int)lVar12;
          auVar30._0_8_ = lVar12;
          auVar30._12_4_ = (int)((ulong)lVar12 >> 0x20);
          lVar10 = lVar10 + 8;
          lVar12 = 3;
          lVar14 = 1;
          lVar15 = 2;
          lVar16 = 0;
          local_48 = auVar30 ^ _DAT_00103020;
          lVar17 = 0;
          do {
            lVar17 = lVar17 + 1;
            uVar20 = 0;
            lVar18 = lVar16;
            lVar19 = lVar14;
            auVar26 = auVar2;
            do {
              bVar1 = local_48._0_4_ < SUB164(auVar26 ^ auVar29,0);
              iVar4 = SUB164(auVar26 ^ auVar29,4);
              iVar5 = local_48._4_4_;
              if ((bool)(~(iVar5 < iVar4 || iVar4 == iVar5 && bVar1) & 1)) {
                *(double *)(lVar10 + -8 + uVar20 * 8) = (double)lVar18;
              }
              if (iVar5 >= iVar4 && (iVar4 != iVar5 || !bVar1)) {
                *(double *)(lVar10 + uVar20 * 8) = (double)lVar19;
              }
              uVar20 = uVar20 + 2;
              lVar28 = auVar26._8_8_;
              auVar26._0_8_ = auVar26._0_8_ + 2;
              auVar26._8_8_ = lVar28 + 2;
              lVar19 = lVar19 + lVar15;
              lVar18 = lVar18 + lVar15;
            } while (uVar22 != uVar20);
            lVar14 = lVar14 + lVar12;
            lVar12 = lVar12 + 2;
            lVar10 = lVar10 + lVar8 * 8;
            lVar16 = lVar16 + lVar15;
            lVar15 = lVar15 + 2;
          } while (lVar17 != lVar9);
          if (lVar8 == lVar9) {
            puVar11 = (undefined8 *)SUNDenseMatrix_Data(local_68);
            auVar29 = _DAT_00103030;
            auVar2 = _DAT_00103020;
            uVar20 = 0;
            auVar23 = _DAT_00103010;
            do {
              bVar1 = local_48._0_4_ < SUB164(auVar23 ^ auVar2,0);
              iVar4 = SUB164(auVar23 ^ auVar2,4);
              iVar5 = local_48._4_4_;
              if ((bool)(~(iVar5 < iVar4 || iVar4 == iVar5 && bVar1) & 1)) {
                *puVar11 = 0x3ff0000000000000;
              }
              if (iVar5 >= iVar4 && (iVar4 != iVar5 || !bVar1)) {
                puVar11[lVar8 + 1] = 0x3ff0000000000000;
              }
              uVar20 = uVar20 + 2;
              lVar12 = auVar23._8_8_;
              auVar23._0_8_ = auVar23._0_8_ + auVar29._0_8_;
              auVar23._8_8_ = lVar12 + auVar29._8_8_;
              puVar11 = puVar11 + lVar8 * 2 + 2;
            } while (uVar22 != uVar20);
          }
          lVar10 = N_VGetArrayPointer(p_Var3);
          auVar2 = _DAT_00103020;
          uVar20 = lVar9 + 1;
          lVar12 = lVar9 + -1;
          auVar24._8_4_ = (int)lVar12;
          auVar24._0_8_ = lVar12;
          auVar24._12_4_ = (int)((ulong)lVar12 >> 0x20);
          uVar13 = 0;
          auVar24 = auVar24 ^ _DAT_00103020;
          auVar27._8_4_ = 0xffffffff;
          auVar27._0_8_ = 0xffffffffffffffff;
          auVar27._12_4_ = 0xffffffff;
          auVar29 = _DAT_00103010;
          do {
            auVar30 = auVar29 ^ auVar2;
            auVar32._0_4_ = -(uint)(auVar24._0_4_ < auVar30._0_4_);
            auVar32._4_4_ = -(uint)(auVar24._4_4_ < auVar30._4_4_);
            auVar32._8_4_ = -(uint)(auVar24._8_4_ < auVar30._8_4_);
            auVar32._12_4_ = -(uint)(auVar24._12_4_ < auVar30._12_4_);
            auVar31._4_4_ = -(uint)(auVar30._4_4_ == auVar24._4_4_);
            auVar31._12_4_ = -(uint)(auVar30._12_4_ == auVar24._12_4_);
            auVar31._0_4_ = auVar31._4_4_;
            auVar31._8_4_ = auVar31._12_4_;
            auVar33._4_4_ = auVar32._4_4_;
            auVar33._0_4_ = auVar32._4_4_;
            auVar33._8_4_ = auVar32._12_4_;
            auVar33._12_4_ = auVar32._12_4_;
            auVar33 = auVar33 | auVar31 & auVar32;
            lVar12 = auVar29._8_8_;
            if ((~auVar33._0_4_ & 1) != 0) {
              *(double *)(lVar10 + uVar13 * 8) = 1.0 / (double)(auVar29._0_8_ + 1);
            }
            if (((auVar33 ^ auVar27) & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(double *)(lVar10 + 8 + uVar13 * 8) = 1.0 / (double)(lVar12 - auVar27._8_8_);
            }
            uVar13 = uVar13 + 2;
            auVar29._0_8_ = auVar29._0_8_ + 2;
            auVar29._8_8_ = lVar12 + 2;
          } while ((uVar20 & 0xfffffffffffffffe) != uVar13);
          lVar12 = N_VGetArrayPointer(y);
          auVar2 = _DAT_00103020;
          uVar13 = 0;
          auVar25 = _DAT_00103010;
          do {
            auVar29 = auVar25 ^ auVar2;
            if ((bool)(~(auVar29._4_4_ == local_48._4_4_ && (int)local_48._0_4_ < auVar29._0_4_ ||
                        (int)local_48._4_4_ < auVar29._4_4_) & 1)) {
              *(double *)(lVar12 + uVar13 * 8) = (double)(long)(uVar20 - 2) * (double)lVar9 * 0.5;
            }
            if ((auVar29._12_4_ != local_48._12_4_ || auVar29._8_4_ <= (int)local_48._8_4_) &&
                auVar29._12_4_ <= (int)local_48._12_4_) {
              *(double *)(lVar12 + 8 + uVar13 * 8) = (double)(long)uVar20 * (double)lVar9 * 0.5;
            }
            uVar13 = uVar13 + 2;
            lVar10 = auVar25._8_8_;
            auVar25._0_8_ = auVar25._0_8_ + 2;
            auVar25._8_8_ = lVar10 + 2;
            uVar20 = uVar20 + 4;
          } while (uVar22 != uVar13);
          iVar4 = Test_SUNMatGetID(A,SUNMATRIX_DENSE,0);
          iVar5 = Test_SUNMatClone(A,0);
          iVar6 = Test_SUNMatCopy(A,0);
          iVar7 = Test_SUNMatZero(A,0);
          iVar4 = iVar7 + iVar6 + iVar5 + iVar4;
          if (lVar8 == lVar9) {
            iVar5 = Test_SUNMatScaleAdd(A,local_68,0);
            iVar6 = Test_SUNMatScaleAddI(A,local_68,0);
            iVar4 = iVar4 + iVar6 + iVar5;
          }
          p_Var3 = local_50;
          iVar5 = Test_SUNMatMatvec(A,local_50,y,0);
          iVar6 = Test_SUNMatSpace(A,0);
          uVar21 = iVar6 + iVar5 + iVar4;
          if (uVar21 == 0) {
            puts("SUCCESS: SUNMatrix module passed all tests \n ");
          }
          else {
            printf("FAIL: SUNMatrix module failed %i tests \n \n",(ulong)uVar21);
            puts("\nA =");
            SUNDenseMatrix_Print(A,_stdout);
            if (lVar8 == lVar9) {
              puts("\nI =");
              SUNDenseMatrix_Print(local_68,_stdout);
            }
            puts("\nx =");
            N_VPrint_Serial(p_Var3);
            puts("\ny =");
            N_VPrint_Serial(y);
          }
          N_VDestroy(p_Var3);
          N_VDestroy(y);
          SUNMatDestroy(A);
          if (lVar8 == lVar9) {
            SUNMatDestroy(local_68);
          }
          SUNContext_Free(&local_58);
          return uVar21;
        }
        __s = "ERROR: number of cols must be a positive integer ";
      }
    }
  }
  else {
    __s = "ERROR: SUNContext_Create failed";
  }
  puts(__s);
  return -1;
}

Assistant:

int main(int argc, char* argv[])
{
  int fails = 0;                 /* counter for test failures  */
  sunindextype matrows, matcols; /* vector length              */
  N_Vector x, y;                 /* test vectors               */
  sunrealtype *xdata, *ydata;    /* pointers to vector data    */
  SUNMatrix A, I;                /* test matrices              */
  sunrealtype *Adata, *Idata;    /* pointers to matrix data    */
  int print_timing, square;
  sunindextype i, j, m, n;
  SUNContext sunctx;

  if (SUNContext_Create(SUN_COMM_NULL, &sunctx))
  {
    printf("ERROR: SUNContext_Create failed\n");
    return (-1);
  }

  /* check input and set vector length */
  if (argc < 4)
  {
    printf("ERROR: THREE (3) Input required: matrix rows, matrix cols, print "
           "timing \n");
    return (-1);
  }

  matrows = (sunindextype)atol(argv[1]);
  if (matrows <= 0)
  {
    printf("ERROR: number of rows must be a positive integer \n");
    return (-1);
  }

  matcols = (sunindextype)atol(argv[2]);
  if (matcols <= 0)
  {
    printf("ERROR: number of cols must be a positive integer \n");
    return (-1);
  }

  print_timing = atoi(argv[3]);
  SetTiming(print_timing);

  square = (matrows == matcols) ? 1 : 0;
  printf("\nDense matrix test: size %ld by %ld\n\n", (long int)matrows,
         (long int)matcols);

  /* Initialize vectors and matrices to NULL */
  x = NULL;
  y = NULL;
  A = NULL;
  I = NULL;

  /* Create vectors and matrices */
  x = N_VNew_Serial(matcols, sunctx);
  y = N_VNew_Serial(matrows, sunctx);
  A = SUNDenseMatrix(matrows, matcols, sunctx);
  I = NULL;
  if (square) { I = SUNDenseMatrix(matrows, matcols, sunctx); }

  /* Fill matrices and vectors */
  Adata = SUNDenseMatrix_Data(A);
  for (j = 0; j < matcols; j++)
  {
    for (i = 0; i < matrows; i++)
    {
      Adata[j * matrows + i] = (j + 1) * (i + j);
    }
  }

  if (square)
  {
    Idata = SUNDenseMatrix_Data(I);
    for (i = 0, j = 0; i < matrows; i++, j++) { Idata[j * matrows + i] = ONE; }
  }

  xdata = N_VGetArrayPointer(x);
  for (i = 0; i < matcols; i++) { xdata[i] = ONE / (i + 1); }

  ydata = N_VGetArrayPointer(y);
  for (i = 0; i < matrows; i++)
  {
    m        = i;
    n        = m + matcols - 1;
    ydata[i] = HALF * (n + 1 - m) * (n + m);
  }

  /* SUNMatrix Tests */
  fails += Test_SUNMatGetID(A, SUNMATRIX_DENSE, 0);
  fails += Test_SUNMatClone(A, 0);
  fails += Test_SUNMatCopy(A, 0);
  fails += Test_SUNMatZero(A, 0);
  if (square)
  {
    fails += Test_SUNMatScaleAdd(A, I, 0);
    fails += Test_SUNMatScaleAddI(A, I, 0);
  }
  fails += Test_SUNMatMatvec(A, x, y, 0);
  fails += Test_SUNMatSpace(A, 0);

  /* Print result */
  if (fails)
  {
    printf("FAIL: SUNMatrix module failed %i tests \n \n", fails);
    printf("\nA =\n");
    SUNDenseMatrix_Print(A, stdout);
    if (square)
    {
      printf("\nI =\n");
      SUNDenseMatrix_Print(I, stdout);
    }
    printf("\nx =\n");
    N_VPrint_Serial(x);
    printf("\ny =\n");
    N_VPrint_Serial(y);
  }
  else { printf("SUCCESS: SUNMatrix module passed all tests \n \n"); }

  /* Free vectors and matrices */
  N_VDestroy(x);
  N_VDestroy(y);
  SUNMatDestroy(A);
  if (square) { SUNMatDestroy(I); }
  SUNContext_Free(&sunctx);

  return (fails);
}